

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O3

void __thiscall irr::CIrrDeviceSDL::setResizable(CIrrDeviceSDL *this,bool resize)

{
  long lVar1;
  undefined7 in_register_00000031;
  
  if (this->Resizable != resize) {
    *(uint *)&(this->super_CIrrDeviceStub).field_0x100 =
         (uint)resize << 5 | *(uint *)&(this->super_CIrrDeviceStub).field_0x100 & 0xffffffdf;
    lVar1 = *(long *)&(this->super_CIrrDeviceStub).field_0xf8;
    if (lVar1 != 0) {
      SDL_SetWindowResizable(lVar1,CONCAT71(in_register_00000031,resize) & 0xffffffff);
    }
    this->Resizable = resize;
  }
  return;
}

Assistant:

void CIrrDeviceSDL::setResizable(bool resize)
{
#ifdef _IRR_EMSCRIPTEN_PLATFORM_
	os::Printer::log("Resizable not available on the web.", ELL_WARNING);
	return;
#else  // !_IRR_EMSCRIPTEN_PLATFORM_
	if (resize != Resizable) {
		if (resize)
			SDL_Flags |= SDL_WINDOW_RESIZABLE;
		else
			SDL_Flags &= ~SDL_WINDOW_RESIZABLE;

		if (Window) {
			SDL_SetWindowResizable(Window, (SDL_bool)resize);
		}
		Resizable = resize;
	}
#endif // !_IRR_EMSCRIPTEN_PLATFORM_
}